

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::TParseContext::structTypeCheck
          (TParseContext *this,TSourceLoc *param_1,TPublicType *publicType)

{
  TType *pTVar1;
  TTypeList *pTVar2;
  bool bVar3;
  int iVar4;
  pointer pTVar5;
  TQualifier *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  uint uVar6;
  TSourceLoc *pTVar7;
  ulong uVar8;
  undefined4 extraout_var;
  
  pTVar1 = publicType->userDef;
  iVar4 = (*pTVar1->_vptr_TType[0x25])(pTVar1);
  if ((char)iVar4 != '\0') {
    pTVar2 = (pTVar1->field_13).structure;
    pTVar5 = (pTVar2->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
             super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((pTVar2->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
        super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
        super__Vector_impl_data._M_finish != pTVar5) {
      uVar6 = 1;
      uVar8 = 0;
      do {
        iVar4 = (*(pTVar5[uVar8].type)->_vptr_TType[10])();
        this_00 = (TQualifier *)CONCAT44(extraout_var,iVar4);
        pTVar5 = (pTVar2->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pTVar7 = &pTVar5[uVar8].loc;
        if ((*(ulong *)&this_00->field_0x8 & 0x31e0e000007e) != 0) {
          iVar4 = (*(pTVar5[uVar8].type)->_vptr_TType[6])();
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,pTVar7,
                     "cannot use storage or interpolation qualifiers on structure members",
                     *(undefined8 *)(CONCAT44(extraout_var_00,iVar4) + 8),"");
        }
        if ((*(uint *)&this_00->field_0xc & 0x3ffc000) != 0) {
          iVar4 = (*((pTVar2->
                     super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                     super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar8].type)->_vptr_TType[6])();
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,pTVar7,"cannot use memory qualifiers on structure members",
                     *(undefined8 *)(CONCAT44(extraout_var_01,iVar4) + 8),"");
        }
        bVar3 = TQualifier::hasNonXfbLayout(this_00);
        if ((bVar3) || (((uint)*(undefined8 *)&this_00->field_0x24 & 0x7fffffff) != 0x7fffffff)) {
          iVar4 = (*((pTVar2->
                     super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                     super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar8].type)->_vptr_TType[6])();
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,pTVar7,"cannot use layout qualifiers on structure members",
                     *(undefined8 *)(CONCAT44(extraout_var_02,iVar4) + 8),"");
          TQualifier::clearLayout(this_00);
        }
        if ((this_00->field_0xb & 0x10) != 0) {
          iVar4 = (*((pTVar2->
                     super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                     super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar8].type)->_vptr_TType[6])();
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,pTVar7,"cannot use invariant qualifier on structure members",
                     *(undefined8 *)(CONCAT44(extraout_var_03,iVar4) + 8),"");
        }
        uVar8 = (ulong)uVar6;
        pTVar5 = (pTVar2->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar6 = uVar6 + 1;
      } while (uVar8 < (ulong)((long)(pTVar2->
                                     super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                     ).
                                     super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar5 >> 5)
              );
    }
    return;
  }
  __assert_fail("isStruct()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
}

Assistant:

void TParseContext::structTypeCheck(const TSourceLoc& /*loc*/, TPublicType& publicType)
{
    const TTypeList& typeList = *publicType.userDef->getStruct();

    // fix and check for member storage qualifiers and types that don't belong within a structure
    for (unsigned int member = 0; member < typeList.size(); ++member) {
        TQualifier& memberQualifier = typeList[member].type->getQualifier();
        const TSourceLoc& memberLoc = typeList[member].loc;
        if (memberQualifier.isAuxiliary() ||
            memberQualifier.isInterpolation() ||
            (memberQualifier.storage != EvqTemporary && memberQualifier.storage != EvqGlobal))
            error(memberLoc, "cannot use storage or interpolation qualifiers on structure members", typeList[member].type->getFieldName().c_str(), "");
        if (memberQualifier.isMemory())
            error(memberLoc, "cannot use memory qualifiers on structure members", typeList[member].type->getFieldName().c_str(), "");
        if (memberQualifier.hasLayout()) {
            error(memberLoc, "cannot use layout qualifiers on structure members", typeList[member].type->getFieldName().c_str(), "");
            memberQualifier.clearLayout();
        }
        if (memberQualifier.invariant)
            error(memberLoc, "cannot use invariant qualifier on structure members", typeList[member].type->getFieldName().c_str(), "");
    }
}